

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_component.cpp
# Opt level: O2

int __thiscall lsim::ModelComponent::copy(ModelComponent *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _Head_base<0UL,_lsim::ModelComponent_*,_false> this_00;
  EVP_PKEY_CTX *pEVar1;
  __single_object clone;
  _Head_base<0UL,_lsim::ModelComponent_*,_false> local_40;
  _Head_base<0UL,_lsim::Property_*,_false> local_38;
  uint local_2c;
  
  local_38._M_head_impl = (Property *)0x0;
  local_2c = 0xffffffff;
  std::
  make_unique<lsim::ModelComponent,decltype(nullptr),int,unsigned_int_const&,unsigned_int_const&,unsigned_int_const&,unsigned_int_const&>
            (&local_40._M_head_impl,(int *)&local_38,&local_2c,(uint *)(dst + 0xc),
             (uint *)(dst + 0x10),(uint *)(dst + 0x14));
  std::__cxx11::string::_M_assign
            ((string *)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_40._M_head_impl)->m_nested_name)->_M_local_buf);
  (local_40._M_head_impl)->m_nested_circuit = *(ModelCircuit **)(dst + 0x40);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&((local_40._M_head_impl)->m_port_lut)._M_h,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)(dst + 0x48));
  pEVar1 = dst + 0x90;
  while (this_00._M_head_impl = local_40._M_head_impl, pEVar1 = *(EVP_PKEY_CTX **)pEVar1,
        pEVar1 != (EVP_PKEY_CTX *)0x0) {
    (**(code **)(**(long **)(pEVar1 + 0x28) + 0x18))(&local_38);
    add_property(this_00._M_head_impl,(uptr_t *)&local_38);
    if (local_38._M_head_impl != (Property *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Property[1])();
    }
  }
  (local_40._M_head_impl)->m_position = *(Point *)(dst + 0xb8);
  *(undefined4 *)&((__node_base *)&(local_40._M_head_impl)->m_angle)->_M_nxt =
       *(undefined4 *)(dst + 0xc0);
  this->m_circuit = (ModelCircuit *)local_40._M_head_impl;
  local_40._M_head_impl = (ModelComponent *)0x0;
  std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::~unique_ptr
            ((unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_> *)
             &local_40);
  return (int)this;
}

Assistant:

ModelComponent::uptr_t ModelComponent::copy() const {
    auto clone = std::make_unique<ModelComponent>(nullptr, -1, m_type, m_inputs, m_outputs, m_controls);
    clone->m_nested_name = m_nested_name;
    clone->m_nested_circuit = m_nested_circuit;
    clone->m_port_lut = m_port_lut;
    for (const auto &prop_it : m_properties) {
        clone->add_property(prop_it.second->clone());
    }
    clone->m_position = m_position;
    clone->m_angle = m_angle;

    return std::move(clone);
}